

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Commands.cpp
# Opt level: O2

void __thiscall
CancelVoteIRCCommand::trigger
          (CancelVoteIRCCommand *this,IRC_Bot *source,string_view channel,string_view nick,
          string_view parameters)

{
  bool bVar1;
  long lVar2;
  Server **server_1;
  long *plVar3;
  Server **server;
  basic_string_view<char,_std::char_traits<char>_> rhs;
  basic_string_view<char,_std::char_traits<char>_> rhs_00;
  basic_string_view<char,_std::char_traits<char>_> rhs_01;
  basic_string_view<char,_std::char_traits<char>_> rhs_02;
  basic_string_view<char,_std::char_traits<char>_> rhs_03;
  basic_string_view<char,_std::char_traits<char>_> rhs_04;
  basic_string_view<char,_std::char_traits<char>_> rhs_05;
  basic_string_view<char,_std::char_traits<char>_> rhs_06;
  basic_string_view<char,_std::char_traits<char>_> rhs_07;
  basic_string_view<char,_std::char_traits<char>_> rhs_08;
  basic_string_view<char,_std::char_traits<char>_> rhs_09;
  long *local_50;
  long *local_48;
  char *local_38;
  
  lVar2 = Jupiter::IRC::Client::getChannel(source,channel._M_len,channel._M_str);
  if (lVar2 != 0) {
    local_38 = nick._M_str;
    RenX::getCore();
    Jupiter::IRC::Client::Channel::getType();
    RenX::Core::getServers((int)&local_50);
    if (local_50 == local_48) {
      Jupiter::IRC::Client::sendMessage
                (source,channel._M_len,channel._M_str,0x40,
                 "Error: Channel not attached to any connected Renegade X servers.");
    }
    else {
      plVar3 = local_50;
      if (((parameters._M_len == 0) ||
          (rhs._M_str = "all", rhs._M_len = 3, bVar1 = jessilib::equalsi<char,char>(parameters,rhs),
          plVar3 = local_50, bVar1)) ||
         (rhs_00._M_str = "a", rhs_00._M_len = 1,
         bVar1 = jessilib::equalsi<char,char>(parameters,rhs_00), plVar3 = local_50, bVar1)) {
        for (; plVar3 != local_48; plVar3 = plVar3 + 1) {
          if (*plVar3 != 0) {
            RenX::Server::cancelVote((TeamType)*plVar3);
            RenX::Server::cancelVote((TeamType)*plVar3);
            RenX::Server::cancelVote((TeamType)*plVar3);
          }
        }
      }
      else {
        rhs_01._M_str = "public";
        rhs_01._M_len = 6;
        bVar1 = jessilib::equalsi<char,char>(parameters,rhs_01);
        plVar3 = local_50;
        if (((((bVar1) ||
              (rhs_02._M_str = "p", rhs_02._M_len = 1,
              bVar1 = jessilib::equalsi<char,char>(parameters,rhs_02), plVar3 = local_50, bVar1)) ||
             ((rhs_03._M_str = "gdi", rhs_03._M_len = 3,
              bVar1 = jessilib::equalsi<char,char>(parameters,rhs_03), plVar3 = local_50, bVar1 ||
              ((rhs_04._M_str = "g", rhs_04._M_len = 1,
               bVar1 = jessilib::equalsi<char,char>(parameters,rhs_04), plVar3 = local_50, bVar1 ||
               (rhs_05._M_str = "blackhand", rhs_05._M_len = 9,
               bVar1 = jessilib::equalsi<char,char>(parameters,rhs_05), plVar3 = local_50, bVar1))))
             )) || (rhs_06._M_str = "bh", rhs_06._M_len = 2,
                   bVar1 = jessilib::equalsi<char,char>(parameters,rhs_06), plVar3 = local_50, bVar1
                   )) ||
           (((rhs_07._M_str = "b", rhs_07._M_len = 1,
             bVar1 = jessilib::equalsi<char,char>(parameters,rhs_07), plVar3 = local_50, bVar1 ||
             (rhs_08._M_str = "nod", rhs_08._M_len = 3,
             bVar1 = jessilib::equalsi<char,char>(parameters,rhs_08), plVar3 = local_50, bVar1)) ||
            (rhs_09._M_str = "n", rhs_09._M_len = 1,
            bVar1 = jessilib::equalsi<char,char>(parameters,rhs_09), plVar3 = local_50, bVar1)))) {
          for (; plVar3 != local_48; plVar3 = plVar3 + 1) {
            if (*plVar3 != 0) {
              RenX::Server::cancelVote((TeamType)*plVar3);
            }
          }
        }
        else {
          Jupiter::IRC::Client::sendNotice
                    (source,nick._M_len,local_38,0x56,
                     "Error: Invalid Team. Allowed values are all/a, public/p, gdi/g, nod/n, blackhand/bh/b."
                    );
        }
      }
    }
    std::_Vector_base<RenX::Server_*,_std::allocator<RenX::Server_*>_>::~_Vector_base
              ((_Vector_base<RenX::Server_*,_std::allocator<RenX::Server_*>_> *)&local_50);
  }
  return;
}

Assistant:

void CancelVoteIRCCommand::trigger(IRC_Bot *source, std::string_view channel, std::string_view nick, std::string_view parameters) {
	Jupiter::IRC::Client::Channel *chan = source->getChannel(channel);
	if (chan == nullptr) {
		return;
	}

	const auto& servers = RenX::getCore()->getServers(chan->getType());
	if (servers.empty()) {
		source->sendMessage(channel, "Error: Channel not attached to any connected Renegade X servers."sv);
		return;
	}

	bool cancel_all = false;
	RenX::TeamType target = RenX::TeamType::None;

	if (parameters.empty()) {
		cancel_all = true;
	} else {
		if (jessilib::equalsi(parameters, "all"sv) || jessilib::equalsi(parameters, "a"sv)) {
			cancel_all = true;
		} else if (jessilib::equalsi(parameters, "public"sv) || jessilib::equalsi(parameters, "p"sv)) {
			target = RenX::TeamType::None;
		} else if (jessilib::equalsi(parameters, "gdi"sv) || jessilib::equalsi(parameters, "g"sv)) {
			target = RenX::TeamType::GDI;
		} else if (jessilib::equalsi(parameters, "blackhand"sv) || jessilib::equalsi(parameters, "bh"sv) || jessilib::equalsi(parameters, "b"sv)) {
			target = RenX::TeamType::GDI;
		} else if (jessilib::equalsi(parameters, "nod"sv) || jessilib::equalsi(parameters, "n"sv)) {
			target = RenX::TeamType::Nod;
		} else {
			source->sendNotice(nick, "Error: Invalid Team. Allowed values are all/a, public/p, gdi/g, nod/n, blackhand/bh/b."sv);
			return;
		}
	}

	if (cancel_all) {
		for (const auto& server : servers) {
			if (server == nullptr) {
				continue;
			}

			server->cancelVote(RenX::TeamType::None);
			server->cancelVote(RenX::TeamType::GDI);
			server->cancelVote(RenX::TeamType::Nod);
		}
	} else {
		for (const auto& server : servers) {
			if (server == nullptr) {
				continue;
			}

			server->cancelVote(target);
		}
	}
}